

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::splitTracksByChannel(MidiFile *this)

{
  MidiEventList *this_00;
  int iVar1;
  int iVar2;
  reference ppMVar3;
  MidiEvent *pMVar4;
  size_type sVar5;
  byte *pbVar6;
  MidiEventList *pMVar7;
  int local_48;
  int trackValue;
  int m_trackCount;
  int length;
  MidiEventList *olddata;
  MidiEventList *eventlist;
  uint local_18;
  int i;
  int maxTrack;
  int oldTimeState;
  MidiFile *this_local;
  
  joinTracks(this);
  iVar1 = getTrackState(this);
  if (iVar1 != 0) {
    iVar1 = getTickState(this);
    if (iVar1 == 0) {
      makeAbsoluteTicks(this);
    }
    local_18 = 0;
    ppMVar3 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,0);
    this_00 = *ppMVar3;
    iVar2 = MidiEventList::size(this_00);
    for (eventlist._4_4_ = 0; eventlist._4_4_ < iVar2; eventlist._4_4_ = eventlist._4_4_ + 1) {
      pMVar4 = MidiEventList::operator[](this_00,eventlist._4_4_);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar4);
      if (sVar5 != 0) {
        pMVar4 = MidiEventList::operator[](this_00,eventlist._4_4_);
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar4,0);
        if ((*pbVar6 & 0xf0) != 0xf0) {
          pMVar4 = MidiEventList::operator[](this_00,eventlist._4_4_);
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar4,0);
          if (local_18 < (*pbVar6 & 0xf)) {
            pMVar4 = MidiEventList::operator[](this_00,eventlist._4_4_);
            pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar4,0);
            local_18 = *pbVar6 & 0xf;
          }
        }
      }
    }
    local_18 = local_18 + 2;
    if (1 < local_18) {
      ppMVar3 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,0);
      *ppMVar3 = (value_type)0x0;
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                (&this->m_events,(long)(int)local_18);
      for (eventlist._4_4_ = 0; eventlist._4_4_ < (int)local_18;
          eventlist._4_4_ = eventlist._4_4_ + 1) {
        pMVar7 = (MidiEventList *)operator_new(0x18);
        MidiEventList::MidiEventList(pMVar7);
        ppMVar3 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,(long)eventlist._4_4_);
        *ppMVar3 = pMVar7;
      }
      for (eventlist._4_4_ = 0; eventlist._4_4_ < iVar2; eventlist._4_4_ = eventlist._4_4_ + 1) {
        local_48 = 0;
        pMVar4 = MidiEventList::operator[](this_00,eventlist._4_4_);
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar4,0);
        if ((*pbVar6 & 0xf0) == 0xf0) {
          local_48 = 0;
        }
        else {
          pMVar4 = MidiEventList::operator[](this_00,eventlist._4_4_);
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar4);
          if (sVar5 != 0) {
            pMVar4 = MidiEventList::operator[](this_00,eventlist._4_4_);
            pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar4,0);
            local_48 = (*pbVar6 & 0xf) + 1;
          }
        }
        ppMVar3 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,(long)local_48);
        pMVar7 = *ppMVar3;
        pMVar4 = MidiEventList::operator[](this_00,eventlist._4_4_);
        MidiEventList::push_back_no_copy(pMVar7,pMVar4);
      }
      MidiEventList::detach(this_00);
      if (this_00 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(this_00);
        operator_delete(this_00);
      }
      if (iVar1 == 0) {
        makeDeltaTicks(this);
      }
      this->m_theTrackState = 0;
    }
  }
  return;
}

Assistant:

void MidiFile::splitTracksByChannel(void) {
	joinTracks();
	if (getTrackState() == TRACK_STATE_SPLIT) {
		return;
	}

	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}

	int maxTrack = 0;
	int i;
	MidiEventList& eventlist = *m_events[0];
	MidiEventList* olddata = &eventlist;
	int length = eventlist.size();
	for (i=0; i<length; i++) {
		if (eventlist[i].size() == 0) {
			continue;
		}
		if ((eventlist[i][0] & 0xf0) == 0xf0) {
			// ignore system and meta messages.
			continue;
		}
		if (maxTrack < (eventlist[i][0] & 0x0f)) {
			maxTrack = eventlist[i][0] & 0x0f;
		}
	}
	int m_trackCount = maxTrack + 2; // + 1 for expression track

	if (m_trackCount <= 1) {
		// only one channel, so don't do anything (leave as Type-0 file).
		return;
	}

	m_events[0] = NULL;
	m_events.resize(m_trackCount);
	for (i=0; i<m_trackCount; i++) {
		m_events[i] = new MidiEventList;
	}

	for (i=0; i<length; i++) {
		int trackValue = 0;
		if ((eventlist[i][0] & 0xf0) == 0xf0) {
			trackValue = 0;
		} else if (eventlist[i].size() > 0) {
			trackValue = (eventlist[i][0] & 0x0f) + 1;
		}
		m_events[trackValue]->push_back_no_copy(&eventlist[i]);
	}

	olddata->detach();
	delete olddata;

	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_SPLIT;
}